

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void EccPoint_double_jacobian(uECC_word_t *X1,uECC_word_t *Y1,uECC_word_t *Z1)

{
  uECC_word_t uVar1;
  uECC_word_t l_carry;
  uECC_word_t t5 [4];
  uECC_word_t t4 [4];
  uECC_word_t *Z1_local;
  uECC_word_t *Y1_local;
  uECC_word_t *X1_local;
  
  uVar1 = vli_isZero(Z1);
  if (uVar1 == 0) {
    vli_modSquare_fast(t5 + 3,Y1);
    vli_modMult_fast(&l_carry,X1,t5 + 3);
    vli_modSquare_fast(t5 + 3,t5 + 3);
    vli_modMult_fast(Y1,Y1,Z1);
    vli_modSquare_fast(Z1,Z1);
    vli_modAdd(X1,X1,Z1,curve_p);
    vli_modAdd(Z1,Z1,Z1,curve_p);
    vli_modSub(Z1,X1,Z1,curve_p);
    vli_modMult_fast(X1,X1,Z1);
    vli_modAdd(Z1,X1,X1,curve_p);
    vli_modAdd(X1,X1,Z1,curve_p);
    uVar1 = vli_testBit(X1,0);
    if (uVar1 == 0) {
      vli_rshift1(X1);
    }
    else {
      uVar1 = vli_add(X1,X1,curve_p);
      vli_rshift1(X1);
      X1[3] = uVar1 << 0x3f | X1[3];
    }
    vli_modSquare_fast(Z1,X1);
    vli_modSub(Z1,Z1,&l_carry,curve_p);
    vli_modSub(Z1,Z1,&l_carry,curve_p);
    vli_modSub(&l_carry,&l_carry,Z1,curve_p);
    vli_modMult_fast(X1,X1,&l_carry);
    vli_modSub(t5 + 3,X1,t5 + 3,curve_p);
    vli_set(X1,Z1);
    vli_set(Z1,Y1);
    vli_set(Y1,t5 + 3);
  }
  return;
}

Assistant:

static void EccPoint_double_jacobian(uECC_word_t * RESTRICT X1,
                                     uECC_word_t * RESTRICT Y1,
                                     uECC_word_t * RESTRICT Z1) {
    /* t1 = X, t2 = Y, t3 = Z */
    uECC_word_t t4[uECC_WORDS];
    uECC_word_t t5[uECC_WORDS];

    if (vli_isZero(Z1)) {
        return;
    }

    vli_modSquare_fast(t4, Y1);   /* t4 = y1^2 */
    vli_modMult_fast(t5, X1, t4); /* t5 = x1*y1^2 = A */
    vli_modSquare_fast(t4, t4);   /* t4 = y1^4 */
    vli_modMult_fast(Y1, Y1, Z1); /* t2 = y1*z1 = z3 */
    vli_modSquare_fast(Z1, Z1);   /* t3 = z1^2 */

    vli_modAdd(X1, X1, Z1, curve_p); /* t1 = x1 + z1^2 */
    vli_modAdd(Z1, Z1, Z1, curve_p); /* t3 = 2*z1^2 */
    vli_modSub_fast(Z1, X1, Z1);     /* t3 = x1 - z1^2 */
    vli_modMult_fast(X1, X1, Z1);    /* t1 = x1^2 - z1^4 */

    vli_modAdd(Z1, X1, X1, curve_p); /* t3 = 2*(x1^2 - z1^4) */
    vli_modAdd(X1, X1, Z1, curve_p); /* t1 = 3*(x1^2 - z1^4) */
    if (vli_testBit(X1, 0)) {
        uECC_word_t l_carry = vli_add(X1, X1, curve_p);
        vli_rshift1(X1);
        X1[uECC_WORDS - 1] |= l_carry << (uECC_WORD_BITS - 1);
    } else {
        vli_rshift1(X1);
    }
    /* t1 = 3/2*(x1^2 - z1^4) = B */

    vli_modSquare_fast(Z1, X1);   /* t3 = B^2 */
    vli_modSub_fast(Z1, Z1, t5);  /* t3 = B^2 - A */
    vli_modSub_fast(Z1, Z1, t5);  /* t3 = B^2 - 2A = x3 */
    vli_modSub_fast(t5, t5, Z1);  /* t5 = A - x3 */
    vli_modMult_fast(X1, X1, t5); /* t1 = B * (A - x3) */
    vli_modSub_fast(t4, X1, t4);  /* t4 = B * (A - x3) - y1^4 = y3 */

    vli_set(X1, Z1);
    vli_set(Z1, Y1);
    vli_set(Y1, t4);
}